

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::PerVertexValidationTest::runPipelineObjectValidationTestMode
          (PerVertexValidationTest *this,_test_iteration iteration)

{
  string *out_tc_body_ptr;
  byte bVar1;
  ApiType ctxType;
  bool bVar2;
  int iVar3;
  _validation _Var4;
  ApiType requiredApiType;
  undefined4 uVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  TestError *this_00;
  long lVar10;
  ulong uVar11;
  allocator<char> local_15b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b8;
  byte local_1592;
  allocator<char> local_1591;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1590;
  byte local_156a;
  allocator<char> local_1569;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1568;
  byte local_1542;
  allocator<char> local_1541;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1540;
  byte local_151a;
  allocator<char> local_1519;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1518;
  undefined1 local_14f8 [8];
  MessageBuilder message;
  _shader_program *current_shader_program_1;
  undefined1 local_1368 [4];
  uint n_shader_program_1;
  MessageBuilder local_1348;
  char local_11c8 [8];
  char info_log [4096];
  _shader_program *current_shader_program;
  uint n_shader_program;
  uint n_shader_programs;
  _shader_program shader_programs [5];
  undefined1 local_100 [8];
  string vs_body;
  int local_d8;
  GLint validate_expected_status;
  GLint validate_status;
  _shader_stage used_shader_stages;
  string te_body;
  string tc_body;
  ContextType local_80;
  int local_7c;
  ContextType min_context_type;
  GLint link_status;
  string gs_body;
  string fs_body;
  undefined8 uStack_30;
  GLenum expected_result;
  char *body_raw_ptr;
  long lStack_20;
  bool result;
  Functions *gl;
  ContextType context_type;
  _test_iteration iteration_local;
  PerVertexValidationTest *this_local;
  
  gl._4_4_ = iteration;
  _context_type = this;
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  gl._0_4_ = (*pRVar7->_vptr_RenderContext[2])();
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar3);
  body_raw_ptr._7_1_ = 0;
  uStack_30 = 0;
  _Var4 = getProgramPipelineValidationExpectedResult(this);
  std::__cxx11::string::string((string *)(gs_body.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&min_context_type);
  glu::ContextType::ContextType(&local_80);
  out_tc_body_ptr = (string *)(&te_body.field_2._M_allocated_capacity + 1);
  std::__cxx11::string::string((string *)out_tc_body_ptr);
  std::__cxx11::string::string((string *)&validate_status);
  std::__cxx11::string::string((string *)local_100);
  shader_programs[0].body_ptr = (string *)&this->m_fs_po_id;
  shader_programs[0].po_id_ptr._0_4_ = 1;
  shader_programs[0].po_id_ptr._4_4_ = 2;
  shader_programs[0].shader_stage = 0x8b30;
  shader_programs[0]._24_8_ = &min_context_type;
  shader_programs[1].body_ptr = (string *)&this->m_gs_po_id;
  shader_programs[1].po_id_ptr._0_4_ = 2;
  shader_programs[1].po_id_ptr._4_4_ = 4;
  shader_programs[1].shader_stage = 0x8dd9;
  shader_programs[2].body_ptr = (string *)&this->m_tc_po_id;
  shader_programs[2].po_id_ptr._0_4_ = 4;
  shader_programs[2].po_id_ptr._4_4_ = 8;
  shader_programs[2].shader_stage = 0x8e88;
  shader_programs[3].body_ptr = (string *)&this->m_te_po_id;
  shader_programs[3].po_id_ptr._0_4_ = 8;
  shader_programs[3].po_id_ptr._4_4_ = 0x10;
  shader_programs[3].shader_stage = 0x8e87;
  shader_programs[4].body_ptr = (string *)&this->m_vs_po_id;
  shader_programs[4].po_id_ptr._0_4_ = 0x10;
  shader_programs[4].po_id_ptr._4_4_ = 1;
  shader_programs[4].shader_stage = 0x8b31;
  shader_programs[1]._24_8_ = out_tc_body_ptr;
  shader_programs[2]._24_8_ = (string *)&validate_status;
  shader_programs[3]._24_8_ = (string *)local_100;
  getTestIterationProperties
            (this,(ContextType)gl._0_4_,gl._4_4_,&local_80,
             (_shader_stage *)&validate_expected_status,(string *)shader_programs[0]._24_8_,
             out_tc_body_ptr,(string *)&validate_status,(string *)local_100);
  ctxType.m_bits = gl._0_4_;
  requiredApiType = glu::ContextType::getAPI(&local_80);
  bVar2 = glu::contextSupports((ContextType)ctxType.m_bits,requiredApiType);
  if (bVar2) {
    for (current_shader_program._4_4_ = 0; current_shader_program._4_4_ < 5;
        current_shader_program._4_4_ = current_shader_program._4_4_ + 1) {
      info_log._4088_8_ = &shader_programs[(ulong)current_shader_program._4_4_ - 1].shader_stage_gl;
      if ((validate_expected_status &
          *(uint *)&shader_programs[current_shader_program._4_4_].po_id_ptr) != 0) {
        uStack_30 = std::__cxx11::string::c_str();
        uVar5 = (**(code **)(lStack_20 + 0x3f8))
                          (*(undefined4 *)(info_log._4088_8_ + 0x18),1,&stack0xffffffffffffffd0);
        **(undefined4 **)(info_log._4088_8_ + 8) = uVar5;
        dVar6 = (**(code **)(lStack_20 + 0x800))();
        glu::checkError(dVar6,"glCreateShaderProgramv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xa3c);
        (**(code **)(lStack_20 + 0x9d8))(**(undefined4 **)(info_log._4088_8_ + 8),0x8b82,&local_7c);
        dVar6 = (**(code **)(lStack_20 + 0x800))();
        glu::checkError(dVar6,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xa3f);
        if (local_7c != 1) {
          bVar2 = isShaderProgramLinkingFailureExpected(this,gl._4_4_);
          if (bVar2) {
            body_raw_ptr._7_1_ = 1;
          }
          else {
            (**(code **)(lStack_20 + 0x988))
                      (**(undefined4 **)(info_log._4088_8_ + 8),0x1000,0,local_11c8);
            pTVar8 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_1348,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar9 = tcu::MessageBuilder::operator<<(&local_1348,(char (*) [14])"The separate ");
            getShaderStageName_abi_cxx11_
                      ((string *)local_1368,this,*(_shader_stage *)(info_log._4088_8_ + 0x10));
            pMVar9 = tcu::MessageBuilder::operator<<
                               (pMVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1368);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (pMVar9,(char (*) [74])
                                       " program failed to link, even though the shader body is valid.\n\nBody:\n>>\n"
                               );
            pMVar9 = tcu::MessageBuilder::operator<<
                               (pMVar9,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         **)info_log._4088_8_);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [16])"<<\nInfo log\n>>\n");
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4096])local_11c8);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])0x2a72680);
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)local_1368);
            tcu::MessageBuilder::~MessageBuilder(&local_1348);
          }
          goto LAB_011b9ee6;
        }
      }
    }
    (**(code **)(lStack_20 + 0x6d8))(1,&this->m_pipeline_id);
    dVar6 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar6,"glGenProgramPipelines() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xa60);
    (**(code **)(lStack_20 + 0x98))(this->m_pipeline_id);
    dVar6 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar6,"glBindProgramPipeline() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xa63);
    for (current_shader_program_1._4_4_ = 0; current_shader_program_1._4_4_ < 5;
        current_shader_program_1._4_4_ = current_shader_program_1._4_4_ + 1) {
      uVar11 = (ulong)current_shader_program_1._4_4_;
      message.m_str._368_8_ = &shader_programs[uVar11 - 1].shader_stage_gl;
      if ((validate_expected_status & *(uint *)&shader_programs[uVar11].po_id_ptr) != 0) {
        (**(code **)(lStack_20 + 0x1688))
                  (this->m_pipeline_id,*(undefined4 *)((long)&shader_programs[uVar11].po_id_ptr + 4)
                   ,*(undefined4 *)shader_programs[uVar11].body_ptr);
        dVar6 = (**(code **)(lStack_20 + 0x800))();
        glu::checkError(dVar6,"glUseProgramStages() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xa6d);
      }
    }
    (**(code **)(lStack_20 + 0x1698))(this->m_pipeline_id);
    dVar6 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar6,"glValidateProgramPipeline() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xa72);
    (**(code **)(lStack_20 + 0x9a0))(this->m_pipeline_id,0x8b83,&local_d8);
    dVar6 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar6,"glGetProgramPipelineiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xa75);
    if (_Var4 == VALIDATION_RESULT_UNDEFINED) {
      body_raw_ptr._7_1_ = 1;
    }
    else {
      if (_Var4 == VALIDATION_RESULT_FALSE) {
        vs_body.field_2._12_4_ = 0;
      }
      else {
        if (_Var4 != VALIDATION_RESULT_TRUE) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                     ,0xa82);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        vs_body.field_2._12_4_ = 1;
      }
      if (local_d8 == vs_body.field_2._12_4_) {
        body_raw_ptr._7_1_ = 1;
      }
      else {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::message((MessageBuilder *)local_14f8,pTVar8);
        if (vs_body.field_2._12_4_ == 0) {
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_14f8,
                     (char (*) [62])"A pipeline object was validated successfully, even though one")
          ;
        }
        else {
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_14f8,
                     (char (*) [61])"A pipeline object was validated negatively, even though none");
        }
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_14f8,
                            (char (*) [55])" of the failure reasons given by spec was applicable.\n"
                           );
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [27])"\nFragment shader body:\n>>\n");
        lVar10 = std::__cxx11::string::length();
        local_151a = 0;
        if (lVar10 == 0) {
          std::allocator<char>::allocator();
          local_151a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1518,"[not used]",&local_1519);
        }
        else {
          std::__cxx11::string::string((string *)&local_1518,(string *)((long)&gs_body.field_2 + 8))
          ;
        }
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1518);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [30])"\n<<\nGeometry shader body:\n>>\n");
        lVar10 = std::__cxx11::string::length();
        local_1542 = 0;
        if (lVar10 == 0) {
          std::allocator<char>::allocator();
          local_1542 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1540,"[not used]",&local_1541);
        }
        else {
          std::__cxx11::string::string((string *)&local_1540,(string *)shader_programs[0]._24_8_);
        }
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1540);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [42])"\n<<\nTessellation control shader body:\n>>\n");
        lVar10 = std::__cxx11::string::length();
        local_156a = 0;
        if (lVar10 == 0) {
          std::allocator<char>::allocator();
          local_156a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1568,"[not used]",&local_1569);
        }
        else {
          std::__cxx11::string::string((string *)&local_1568,(string *)shader_programs[1]._24_8_);
        }
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1568);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [45])"\n<<\nTessellation evaluation shader body:\n>>\n"
                           );
        lVar10 = std::__cxx11::string::length();
        local_1592 = 0;
        if (lVar10 == 0) {
          std::allocator<char>::allocator();
          local_1592 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1590,"[not used]",&local_1591);
        }
        else {
          std::__cxx11::string::string((string *)&local_1590,(string *)shader_programs[2]._24_8_);
        }
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1590);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [28])"\n<<\nVertex shader body:\n>>\n");
        lVar10 = std::__cxx11::string::length();
        if (lVar10 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_15b8,"[not used]",&local_15b9);
        }
        else {
          std::__cxx11::string::string((string *)&local_15b8,(string *)shader_programs[3]._24_8_);
        }
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_15b8);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_15b8);
        if (lVar10 == 0) {
          std::allocator<char>::~allocator(&local_15b9);
        }
        std::__cxx11::string::~string((string *)&local_1590);
        if ((local_1592 & 1) != 0) {
          std::allocator<char>::~allocator(&local_1591);
        }
        std::__cxx11::string::~string((string *)&local_1568);
        if ((local_156a & 1) != 0) {
          std::allocator<char>::~allocator(&local_1569);
        }
        std::__cxx11::string::~string((string *)&local_1540);
        if ((local_1542 & 1) != 0) {
          std::allocator<char>::~allocator(&local_1541);
        }
        std::__cxx11::string::~string((string *)&local_1518);
        if ((local_151a & 1) != 0) {
          std::allocator<char>::~allocator(&local_1519);
        }
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_14f8);
      }
    }
  }
  else {
    body_raw_ptr._7_1_ = 1;
  }
LAB_011b9ee6:
  bVar1 = body_raw_ptr._7_1_;
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&validate_status);
  std::__cxx11::string::~string((string *)(te_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&min_context_type);
  std::__cxx11::string::~string((string *)(gs_body.field_2._M_local_buf + 8));
  return (bool)(bVar1 & 1);
}

Assistant:

bool PerVertexValidationTest::runPipelineObjectValidationTestMode(_test_iteration iteration)
{
	const glu::ContextType context_type = m_context.getRenderContext().getType();
	const glw::Functions&  gl			= m_context.getRenderContext().getFunctions();
	bool				   result		= false;

	const char*		 body_raw_ptr	= NULL;
	glw::GLenum		 expected_result = getProgramPipelineValidationExpectedResult();
	std::string		 fs_body;
	std::string		 gs_body;
	glw::GLint		 link_status;
	glu::ContextType min_context_type;
	std::string		 tc_body;
	std::string		 te_body;
	_shader_stage	used_shader_stages;
	glw::GLint		 validate_status;
	glw::GLint		 validate_expected_status;
	std::string		 vs_body;

	struct _shader_program
	{
		std::string*  body_ptr;
		glw::GLuint*  po_id_ptr;
		_shader_stage shader_stage;
		glw::GLenum   shader_stage_bit_gl;
		glw::GLenum   shader_stage_gl;
	} shader_programs[] = {
		{ &fs_body, &m_fs_po_id, SHADER_STAGE_FRAGMENT, GL_FRAGMENT_SHADER_BIT, GL_FRAGMENT_SHADER },
		{ &gs_body, &m_gs_po_id, SHADER_STAGE_GEOMETRY, GL_GEOMETRY_SHADER_BIT, GL_GEOMETRY_SHADER },
		{ &tc_body, &m_tc_po_id, SHADER_STAGE_TESSELLATION_CONTROL, GL_TESS_CONTROL_SHADER_BIT,
		  GL_TESS_CONTROL_SHADER },
		{ &te_body, &m_te_po_id, SHADER_STAGE_TESSELLATION_EVALUATION, GL_TESS_EVALUATION_SHADER_BIT,
		  GL_TESS_EVALUATION_SHADER },
		{ &vs_body, &m_vs_po_id, SHADER_STAGE_VERTEX, GL_VERTEX_SHADER_BIT, GL_VERTEX_SHADER },
	};
	const unsigned int n_shader_programs =
		static_cast<const unsigned int>(sizeof(shader_programs) / sizeof(shader_programs[0]));

	/* Make sure the test iteration can actually be run under the running rendering context
	 * version.
	 */
	getTestIterationProperties(context_type, iteration, &min_context_type, &used_shader_stages, &gs_body, &tc_body,
							   &te_body, &vs_body);

	if (!glu::contextSupports(context_type, min_context_type.getAPI()))
	{
		result = true;

		goto end;
	}

	/* Set up shader program objects. All shader bodies by themselves are valid, so all shaders should
	 * link just fine. */
	for (unsigned int n_shader_program = 0; n_shader_program < n_shader_programs; ++n_shader_program)
	{
		_shader_program& current_shader_program = shader_programs[n_shader_program];

		if ((used_shader_stages & current_shader_program.shader_stage) != 0)
		{
			body_raw_ptr = current_shader_program.body_ptr->c_str();
			*current_shader_program.po_id_ptr =
				gl.createShaderProgramv(current_shader_program.shader_stage_gl, 1, /* count */
										&body_raw_ptr);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

			gl.getProgramiv(*current_shader_program.po_id_ptr, GL_LINK_STATUS, &link_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

			if (link_status != GL_TRUE)
			{
				char info_log[4096];

				if (!isShaderProgramLinkingFailureExpected(iteration))
				{
					gl.getProgramInfoLog(*current_shader_program.po_id_ptr, sizeof(info_log), DE_NULL, /* length */
										 info_log);

					m_testCtx.getLog() << tcu::TestLog::Message << "The separate "
									   << getShaderStageName(current_shader_program.shader_stage)
									   << " program "
										  "failed to link, even though the shader body is valid.\n"
										  "\n"
										  "Body:\n>>\n"
									   << *current_shader_program.body_ptr << "<<\nInfo log\n>>\n"
									   << info_log << "<<\n"
									   << tcu::TestLog::EndMessage;
				}
				else
				{
					result = true;
				}

				goto end;
			} /* if (link_status != GL_TRUE) */
		}	 /* for (all shader programs) */
	}		  /* for (all shader stages) */

	/* Now that all shader programs are ready, set up a test-specific pipeline object and validate it. */
	gl.genProgramPipelines(1, &m_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

	gl.bindProgramPipeline(m_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

	for (unsigned int n_shader_program = 0; n_shader_program < n_shader_programs; ++n_shader_program)
	{
		_shader_program& current_shader_program = shader_programs[n_shader_program];

		if ((used_shader_stages & current_shader_program.shader_stage) != 0)
		{
			gl.useProgramStages(m_pipeline_id, current_shader_program.shader_stage_bit_gl,
								*current_shader_program.po_id_ptr);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");
		}
	} /* for (all shader programs) */

	gl.validateProgramPipeline(m_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glValidateProgramPipeline() call failed.");

	gl.getProgramPipelineiv(m_pipeline_id, GL_VALIDATE_STATUS, &validate_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() call failed.");

	if (VALIDATION_RESULT_UNDEFINED != expected_result)
	{
		switch (expected_result)
		{
		case VALIDATION_RESULT_FALSE:
			validate_expected_status = GL_FALSE;
			break;
		case VALIDATION_RESULT_TRUE:
			validate_expected_status = GL_TRUE;
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}

		if (validate_status != validate_expected_status)
		{
			tcu::MessageBuilder message = m_testCtx.getLog().message();

			if (GL_FALSE == validate_expected_status)
			{
				message << "A pipeline object was validated successfully, even though one";
			}
			else
			{
				message << "A pipeline object was validated negatively, even though none";
			}

			message << " of the failure reasons given by spec was applicable.\n"
					<< "\n"
					   "Fragment shader body:\n>>\n"
					<< ((shader_programs[0].body_ptr->length() > 0) ? *shader_programs[0].body_ptr : "[not used]")
					<< "\n<<\nGeometry shader body:\n>>\n"
					<< ((shader_programs[1].body_ptr->length() > 0) ? *shader_programs[1].body_ptr : "[not used]")
					<< "\n<<\nTessellation control shader body:\n>>\n"
					<< ((shader_programs[2].body_ptr->length() > 0) ? *shader_programs[2].body_ptr : "[not used]")
					<< "\n<<\nTessellation evaluation shader body:\n>>\n"
					<< ((shader_programs[3].body_ptr->length() > 0) ? *shader_programs[3].body_ptr : "[not used]")
					<< "\n<<\nVertex shader body:\n>>\n"
					<< ((shader_programs[4].body_ptr->length() > 0) ? *shader_programs[4].body_ptr : "[not used]")
					<< tcu::TestLog::EndMessage;
		} /* if (validate_status != validate_expected_status) */
		else
		{
			result = true;
		}
	}
	else
	{
		result = true;
	}

end:
	return result;
}